

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

bool __thiscall wirehair::Codec::Triangle(Codec *this)

{
  ulong uVar1;
  ulong *puVar2;
  uint8_t uVar3;
  uint8_t y;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint16_t *puVar8;
  uint64_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  long lVar12;
  bool bVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ushort *puVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  uint local_9c;
  ulong local_88;
  undefined1 auVar34 [32];
  
  uVar20 = this->_next_pivot;
  uVar6 = this->_first_heavy_column;
  if (uVar20 < uVar6) {
    bVar13 = TriangleNonHeavy(this);
    if (!bVar13) {
      return false;
    }
    uVar20 = this->_next_pivot;
  }
  uVar19 = (uint)this->_mix_count + (uint)this->_defer_count;
  if (uVar20 < uVar19) {
    uVar7 = this->_pivot_count;
    auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar42 = ZEXT3264(CONCAT428(0x3f,CONCAT424(0x3f,CONCAT420(0x3f,CONCAT416(0x3f,CONCAT412(0x3f,
                                                  CONCAT48(0x3f,0x3f0000003f)))))));
    auVar38 = vpbroadcastq_avx512f(ZEXT816(0xf));
    auVar43 = ZEXT3264(CONCAT428(0x20,CONCAT424(0x20,CONCAT420(0x20,CONCAT416(0x20,CONCAT412(0x20,
                                                  CONCAT48(0x20,0x2000000020)))))));
    iVar16 = (uint)this->_dense_count + (uint)this->_defer_count;
    local_88 = 1L << ((ulong)uVar20 & 0x3f);
    local_9c = this->_first_heavy_pivot;
    uVar27 = (ulong)uVar20;
    do {
      uVar1 = uVar27 + 1;
      uVar30 = (ulong)local_9c;
      uVar21 = (uint)uVar27;
      uVar14 = uVar21 - uVar6;
      uVar20 = uVar21;
      if (uVar27 < uVar30) {
        puVar8 = this->_pivots;
        uVar28 = this->_ge_pitch;
        uVar26 = (uint)(uVar27 >> 6) & 0x3ffffff;
        puVar9 = this->_ge_matrix;
        uVar18 = uVar1;
        uVar15 = uVar27;
LAB_001049a6:
        uVar5 = puVar8[uVar18 - 1];
        uVar31 = (ulong)(uVar28 * uVar5);
        uVar23 = *(ulong *)((long)puVar9 + uVar31 * 8 + (ulong)(uVar26 * 8));
        if ((local_88 & uVar23) == 0) goto code_r0x001049c6;
        puVar8[uVar18 - 1] = puVar8[uVar27];
        puVar8[uVar27] = uVar5;
        if ((uint)uVar18 < local_9c) {
          do {
            uVar15 = (ulong)(puVar8[uVar18] * uVar28);
            uVar27 = *(ulong *)((long)puVar9 + uVar15 * 8 + (ulong)(uVar26 * 8));
            if (((local_88 & uVar27) != 0) &&
               (*(ulong *)((long)puVar9 + uVar15 * 8 + (ulong)(uVar26 * 8)) =
                     uVar27 ^ uVar23 & -local_88 ^ local_88, 1 < uVar28 - uVar26)) {
              uVar27 = 1;
              do {
                puVar2 = (ulong *)((long)puVar9 + uVar27 * 8 + uVar15 * 8 + (ulong)(uVar26 * 8));
                *puVar2 = *puVar2 ^ *(ulong *)((long)puVar9 +
                                              uVar27 * 8 + uVar31 * 8 + (ulong)(uVar26 * 8));
                uVar27 = uVar27 + 1;
              } while (uVar27 < uVar28 - uVar26);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 < uVar30);
        }
        if ((uint)uVar18 < uVar7) {
          uVar18 = uVar18 & 0xffffffff;
          uVar27 = local_88 >> 0x3f | local_88 << 1;
          uVar20 = (uVar21 & 0xfffffffc) + 4;
          uVar28 = uVar21 + 1;
          do {
            uVar26 = ((uint)this->_pivots[uVar18] - iVar16) * this->_heavy_pitch;
            puVar10 = this->_heavy_matrix;
            bVar4 = puVar10[(ulong)uVar14 + (ulong)uVar26];
            if (bVar4 != 0) {
              uVar17 = this->_ge_pitch * (uint)uVar5;
              puVar9 = this->_ge_matrix;
              uVar30 = local_88;
              uVar15 = uVar27;
              uVar23 = (ulong)(uVar28 >> 6);
              uVar24 = uVar21 + 1;
              uVar25 = uVar28;
              uVar29 = uVar28;
              switch(uVar21 & 3) {
              case 0:
                uVar30 = uVar27;
                uVar24 = uVar21 + 2;
                if ((puVar9[(ulong)uVar17 + (ulong)(uVar28 >> 6)] & uVar27) != 0) {
                  puVar10[(ulong)(uVar28 - this->_first_heavy_column) + (ulong)uVar26] =
                       puVar10[(ulong)(uVar28 - this->_first_heavy_column) + (ulong)uVar26] ^ bVar4;
                }
              case 1:
                uVar15 = uVar30 >> 0x3f | uVar30 << 1;
                if ((puVar9[(ulong)uVar17 + (ulong)(uVar24 >> 6)] & uVar15) != 0) {
                  puVar10[(ulong)(uVar24 - this->_first_heavy_column) + (ulong)uVar26] =
                       puVar10[(ulong)(uVar24 - this->_first_heavy_column) + (ulong)uVar26] ^ bVar4;
                }
                uVar25 = uVar24 + 1;
                uVar15 = (uVar30 << 1) >> 0x3f | uVar15 << 1;
                uVar23 = (ulong)(uVar25 >> 6);
              case 2:
                uVar29 = uVar20;
                if ((puVar9[uVar17 + uVar23] & uVar15) != 0) {
                  puVar10[(ulong)(uVar25 - this->_first_heavy_column) + (ulong)uVar26] =
                       puVar10[(ulong)(uVar25 - this->_first_heavy_column) + (ulong)uVar26] ^ bVar4;
                }
              case 3:
                if (uVar29 < uVar19) {
                  auVar32 = vpbroadcastd_avx512vl();
                  auVar32 = vpaddd_avx2(auVar32,_DAT_00109840);
                  auVar33 = vpbroadcastd_avx512vl();
                  lVar12 = ((ulong)uVar29 - (ulong)uVar6) + (ulong)uVar26;
                  uVar26 = uVar29 + 4;
                  if (uVar29 + 4 < uVar19) {
                    uVar26 = uVar19;
                  }
                  auVar39 = vpbroadcastq_avx512f();
                  uVar30 = 0;
                  do {
                    auVar40 = vpbroadcastq_avx512f();
                    auVar34 = vpand_avx2(auVar32,auVar42._0_32_);
                    auVar40 = vporq_avx512f(auVar40,auVar37);
                    uVar15 = vpcmpuq_avx512f(auVar40,auVar39,2);
                    vpsrld_avx2(auVar32,6);
                    auVar32 = vpaddd_avx2(auVar43._0_32_,auVar32);
                    auVar40 = vpgatherdq_avx512f((int)puVar9[(long)&this->_block_bytes +
                                                             (ulong)uVar17]);
                    bVar4 = (byte)uVar15;
                    auVar41._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * auVar40._8_8_;
                    auVar41._0_8_ = (ulong)(bVar4 & 1) * auVar40._0_8_;
                    auVar41._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * auVar40._16_8_;
                    auVar41._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * auVar40._24_8_;
                    auVar41._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * auVar40._32_8_;
                    auVar41._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * auVar40._40_8_;
                    auVar41._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * auVar40._48_8_;
                    auVar41._56_8_ = (uVar15 >> 7) * auVar40._56_8_;
                    auVar40 = vpmovzxdq_avx512f(auVar34);
                    auVar34 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                  (puVar10 + uVar30 * 4 + lVar12));
                    auVar35._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar34._4_4_;
                    auVar35._0_4_ = (uint)(bVar4 & 1) * auVar34._0_4_;
                    auVar35._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar34._8_4_;
                    auVar35._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar34._12_4_;
                    auVar35._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar34._16_4_;
                    auVar35._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar34._20_4_;
                    auVar35._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar34._24_4_;
                    auVar35._28_4_ = (uint)(byte)(uVar15 >> 7) * auVar34._28_4_;
                    auVar40 = vpsrlvq_avx512f(auVar41,auVar40);
                    vpandq_avx512f(auVar40,auVar38);
                    auVar34 = vpgatherqd_avx512f(*(undefined8 *)(GF256_MULT_LOOKUP + (long)this * 4)
                                                );
                    auVar36._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar34._4_4_;
                    auVar36._0_4_ = (uint)(bVar4 & 1) * auVar34._0_4_;
                    auVar36._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar34._8_4_;
                    auVar36._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar34._12_4_;
                    auVar36._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar34._16_4_;
                    auVar36._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar34._20_4_;
                    auVar36._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar34._24_4_;
                    auVar36._28_4_ = (uint)(byte)(uVar15 >> 7) * auVar34._28_4_;
                    auVar34 = vpmulld_avx2(auVar36,auVar33);
                    auVar34 = vmovdqu32_avx512vl(auVar35 ^ auVar34);
                    *(undefined1 (*) [32])(puVar10 + uVar30 * 4 + lVar12) = auVar34;
                    uVar30 = uVar30 + 8;
                  } while (((~uVar29 + uVar26 >> 2) + 8 & 0xfffffff8) != uVar30);
                }
              }
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar7);
        }
        goto LAB_00104dd5;
      }
LAB_001049d4:
      if (this->_pivot_count <= uVar20) {
LAB_00104dfd:
        this->_next_pivot = uVar21;
        this->_first_heavy_pivot = local_9c;
        return false;
      }
      puVar8 = this->_pivots;
      puVar10 = this->_heavy_matrix;
      puVar22 = puVar8 + uVar20;
      while( true ) {
        uVar20 = uVar20 + 1;
        uVar5 = *puVar22;
        uVar28 = ((uint)uVar5 - iVar16) * this->_heavy_pitch;
        uVar3 = puVar10[(ulong)uVar14 + (ulong)uVar28];
        if (uVar3 != '\0') break;
        puVar22 = puVar22 + 1;
        if ((1 - this->_pivot_count) + uVar20 == 1) goto LAB_00104dfd;
      }
      *puVar22 = puVar8[uVar27];
      puVar8[uVar27] = uVar5;
      if (uVar27 < uVar30) {
        local_9c = local_9c + 1;
        uVar5 = puVar8[uVar30];
        puVar8[uVar30] = *puVar22;
        *puVar22 = uVar5;
      }
      if (uVar20 < uVar7) {
        uVar27 = (ulong)uVar20;
        uVar20 = uVar14 + 1;
        do {
          uVar21 = ((uint)this->_pivots[uVar27] - iVar16) * this->_heavy_pitch;
          puVar11 = this->_heavy_matrix;
          if (puVar11[(ulong)uVar14 + (ulong)uVar21] != '\0') {
            y = GF256Ctx.GF256_DIV_TABLE[CONCAT11(uVar3,puVar11[(ulong)uVar14 + (ulong)uVar21])];
            puVar11[(ulong)uVar14 + (ulong)uVar21] = y;
            gf256_muladd_mem(puVar11 + (ulong)uVar20 + (ulong)uVar21,y,
                             puVar10 + (ulong)uVar20 + (ulong)uVar28,this->_heavy_columns - uVar20);
            auVar43 = ZEXT3264(CONCAT428(0x20,CONCAT424(0x20,CONCAT420(0x20,CONCAT416(0x20,CONCAT412
                                                  (0x20,CONCAT48(0x20,0x2000000020)))))));
            auVar38 = vpbroadcastq_avx512f(ZEXT816(0xf));
            auVar42 = ZEXT3264(CONCAT428(0x3f,CONCAT424(0x3f,CONCAT420(0x3f,CONCAT416(0x3f,CONCAT412
                                                  (0x3f,CONCAT48(0x3f,0x3f0000003f)))))));
            auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 < uVar7);
      }
LAB_00104dd5:
      local_88 = local_88 >> 0x3f | local_88 << 1;
      uVar27 = uVar1;
    } while (uVar1 != uVar19);
  }
  return true;
code_r0x001049c6:
  uVar20 = (int)uVar15 + 1;
  uVar15 = (ulong)uVar20;
  bVar13 = uVar30 <= uVar18;
  uVar18 = uVar18 + 1;
  if (bVar13) goto LAB_001049d4;
  goto LAB_001049a6;
}

Assistant:

bool Codec::Triangle()
{
    CAT_IF_DUMP(cout << endl << "---- Triangle ----" << endl << endl;)

    const unsigned first_heavy_column = _first_heavy_column;

    // If next pivot is not heavy:
    if (_next_pivot < first_heavy_column &&
        !TriangleNonHeavy())
    {
        return false;
    }

    const unsigned pivot_count = _pivot_count;
    const unsigned column_count = _defer_count + _mix_count;
    const unsigned first_heavy_row = _defer_count + _dense_count;
    unsigned first_heavy_pivot = _first_heavy_pivot;

    uint64_t ge_mask = (uint64_t)1 << (_next_pivot & 63);

    // For each heavy pivot to determine:
    for (unsigned pivot_i = _next_pivot; pivot_i < column_count;
        ++pivot_i, ge_mask = CAT_ROL64(ge_mask, 1))
    {
        CAT_DEBUG_ASSERT(pivot_i >= first_heavy_column);
        const unsigned heavy_col_i = pivot_i - first_heavy_column;

        const unsigned word_offset = pivot_i >> 6;
        uint64_t * GF256_RESTRICT ge_matrix_offset = _ge_matrix + word_offset;
        bool found = false;
        unsigned pivot_j;

        // For each remaining GE row that might be the pivot:
        for (pivot_j = pivot_i; pivot_j < first_heavy_pivot; ++pivot_j)
        {
            const unsigned ge_row_j = _pivots[pivot_j];
            uint64_t * GF256_RESTRICT ge_row = &ge_matrix_offset[_ge_pitch * ge_row_j];

            // If the bit was not found:
            if (0 == (*ge_row & ge_mask)) {
                continue; // Skip to next
            }

            // Found it!
            found = true;

            CAT_IF_DUMP(cout << "Pivot " << pivot_i << " found on row " << ge_row_j << endl;)

            // Swap out the pivot index for this one
            _pivots[pivot_j] = _pivots[pivot_i];
            CAT_DEBUG_ASSERT(ge_row_j < _pivot_count);
            _pivots[pivot_i] = (uint16_t)ge_row_j;

            // Prepare masked first word
            const uint64_t row0 = (*ge_row & ~(ge_mask - 1)) ^ ge_mask;

            unsigned pivot_k = pivot_j + 1;

            // For each remaining light row:
            for (; pivot_k < first_heavy_pivot; ++pivot_k)
            {
                // Determine if the row contains the bit we want
                unsigned ge_row_k = _pivots[pivot_k];
                uint64_t * GF256_RESTRICT rem_row = &ge_matrix_offset[_ge_pitch * ge_row_k];

                // If the bit was found:
                if (0 != (*rem_row & ge_mask))
                {
                    // Unroll first word to handle masked word and for speed
                    *rem_row ^= row0;

                    // Add the pivot row to eliminate the bit from this row, preserving previous bits
                    for (unsigned ii = 1, end = _ge_pitch - word_offset; ii < end; ++ii) {
                        rem_row[ii] ^= ge_row[ii];
                    }
                }
            } // next remaining row

            // For each remaining heavy row:
            for (; pivot_k < pivot_count; ++pivot_k)
            {
                CAT_DEBUG_ASSERT(_pivots[pivot_k] >= first_heavy_row);
                const unsigned heavy_row_k = _pivots[pivot_k] - first_heavy_row;

                uint8_t * GF256_RESTRICT rem_row = &_heavy_matrix[_heavy_pitch * heavy_row_k];
                const uint8_t code_value = rem_row[heavy_col_i];

                // If the column is non-zero:
                if (0 == code_value) {
                    continue;
                }

                CAT_IF_DUMP(cout << "Eliminating from heavy row " << heavy_row_k << " :";)

                // For each set bit in the binary pivot row, add rem[i] to rem[i+]:
                uint64_t * GF256_RESTRICT pivot_row = &_ge_matrix[_ge_pitch * ge_row_j];

#if !defined(CAT_HEAVY_WIN_MULT)
                for (unsigned ge_column_i = pivot_i + 1; ge_column_i < column_count; ++ge_column_i)
                {
                    const uint64_t mask = (uint64_t)1 << (ge_column_i & 63);
                    const uint64_t word = pivot_row[ge_column_i >> 6];
                    const bool nonzero = 0 != (word & mask);

                    if (nonzero) {
                        rem_row[ge_column_i - first_heavy_column] ^= code_value;
                    }
                }
#else // CAT_HEAVY_WIN_MULT
                const unsigned odd_count = pivot_i & 3;
                unsigned ge_column_i = pivot_i + 1;
                uint64_t temp_mask = ge_mask;

                // Unroll odd columns:
                switch (odd_count)
                {
                case 0: temp_mask = CAT_ROL64(temp_mask, 1);
                        if (0 != (pivot_row[ge_column_i >> 6] & temp_mask))
                        {
                            CAT_DEBUG_ASSERT(ge_column_i >= _first_heavy_column);
                            rem_row[ge_column_i - _first_heavy_column] ^= code_value;
                            CAT_IF_DUMP(cout << " " << ge_column_i;)
                        }
                        ++ge_column_i;

                        // Fall-thru...
                case 1: temp_mask = CAT_ROL64(temp_mask, 1);
                        if (0 != (pivot_row[ge_column_i >> 6] & temp_mask))
                        {
                            CAT_DEBUG_ASSERT(ge_column_i >= _first_heavy_column);
                            rem_row[ge_column_i - _first_heavy_column] ^= code_value;
                            CAT_IF_DUMP(cout << " " << ge_column_i;)
                        }
                        ++ge_column_i;

                        // Fall-thru...
                case 2: temp_mask = CAT_ROL64(temp_mask, 1);
                        if (0 != (pivot_row[ge_column_i >> 6] & temp_mask))
                        {
                            CAT_DEBUG_ASSERT(ge_column_i >= _first_heavy_column);
                            rem_row[ge_column_i - _first_heavy_column] ^= code_value;
                            CAT_IF_DUMP(cout << " " << ge_column_i;)
                        }

                        // Set GE column to next even column
                        CAT_DEBUG_ASSERT(odd_count <= 4);
                        ge_column_i = pivot_i + (4 - odd_count);
                }

                uint32_t * GF256_RESTRICT word = reinterpret_cast<uint32_t*>(rem_row + ge_column_i - first_heavy_column);

                // For remaining aligned columns:
                for (; ge_column_i < column_count; ge_column_i += 4, ++word)
                {
                    // Look up 4 bit window
                    const uint32_t bits = (uint32_t)(pivot_row[ge_column_i >> 6] >> (ge_column_i & 63)) & 15;
#if defined(CAT_ENDIAN_UNKNOWN)
                    const uint32_t window = getLE(GF256_MULT_LOOKUP[bits]);
#else
                    const uint32_t window = GF256_MULT_LOOKUP[bits];
#endif

                    CAT_IF_DUMP(cout << " " << ge_column_i << "x" << hex << setw(8) << setfill('0') << window << dec;)

                    *word ^= window * code_value;
                }
#endif // CAT_HEAVY_WIN_MULT
                CAT_IF_DUMP(cout << endl;)
            } // next heavy row

            break;
        } // next row

        // If not found, then for each remaining heavy pivot:
        // NOTE: The pivot array maintains the heavy rows at the end so that they are always tried last
        if (!found) for (; pivot_j < _pivot_count; ++pivot_j)
        {
            const unsigned ge_row_j = _pivots[pivot_j];
            CAT_DEBUG_ASSERT(ge_row_j >= first_heavy_row);
            const unsigned heavy_row_j = ge_row_j - first_heavy_row;
            CAT_DEBUG_ASSERT(heavy_row_j < _heavy_rows);
            uint8_t * GF256_RESTRICT pivot_row = &_heavy_matrix[_heavy_pitch * heavy_row_j];
            const uint8_t code_value = pivot_row[heavy_col_i];

            // If heavy row doesn't have the pivot:
            if (0 == code_value) {
                continue; // Skip to next
            }

            // Found it! (common case)
            found = true;

            CAT_IF_DUMP(cout << "Pivot " << pivot_i << " found on heavy row " << ge_row_j << endl;)

            // Swap pivot i and j
            _pivots[pivot_j] = _pivots[pivot_i];
            _pivots[pivot_i] = (uint16_t)ge_row_j;

            // If a non-heavy pivot just got moved into heavy pivot list:
            if (pivot_i < first_heavy_pivot)
            {
                // Swap pivot j with first heavy pivot
                const uint16_t temp = _pivots[first_heavy_pivot];
                _pivots[first_heavy_pivot] = _pivots[pivot_j];
                _pivots[pivot_j] = temp;

                // And move the first heavy pivot up one to cover the hole
                ++first_heavy_pivot;
            }

            unsigned pivot_k = pivot_j + 1;

            // If there are any remaining rows:
            if (pivot_k < pivot_count)
            {
                // For each remaining unused row:
                // Note all remaining rows are heavy rows by pivot array organization
                for (; pivot_k < pivot_count; ++pivot_k)
                {
                    const unsigned ge_row_k = _pivots[pivot_k];
                    CAT_DEBUG_ASSERT(ge_row_k >= first_heavy_row);
                    const unsigned heavy_row_k = ge_row_k - first_heavy_row;
                    CAT_DEBUG_ASSERT(heavy_row_k < _heavy_rows);
                    uint8_t * GF256_RESTRICT rem_row = &_heavy_matrix[_heavy_pitch * heavy_row_k];
                    const uint8_t rem_value = rem_row[heavy_col_i];

                    // If the column is zero:
                    if (0 == rem_value) {
                        continue; // Skip it
                    }

                    // x = rem_value / code_value
                    const uint8_t x = gf256_div(rem_value, code_value);

                    // Store value for later
                    rem_row[heavy_col_i] = x;

                    const unsigned offset = heavy_col_i + 1;
                    CAT_DEBUG_ASSERT(_heavy_columns >= offset);

                    // rem[i+] += x * pivot[i+]
                    gf256_muladd_mem(
                        rem_row + offset,
                        x,
                        pivot_row + offset,
                        _heavy_columns - offset);
                } // next remaining row
            }

            break;
        } // next heavy row

        // If pivot could not be found:
        if (!found)
        {
            _next_pivot = pivot_i;
            _first_heavy_pivot = first_heavy_pivot;

            CAT_IF_DUMP(cout << "Singular: Pivot " << pivot_i << " of " <<
                (_defer_count + _mix_count) << " not found!" << endl;)

            CAT_IF_PIVOT(if (pivot_i + 16 < (unsigned)(_defer_count + _mix_count)) {
                cout << ">>>>> Singular: Pivot " << pivot_i << " of " <<
                    (_defer_count + _mix_count) << " not found!" << endl << endl;
            })

            return false;
        }

        CAT_IF_DUMP( PrintGEMatrix(); )
        CAT_IF_DUMP( PrintExtraMatrix(); )
    }

    return true;
}